

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

example * VW::import_example(vw *all,string *label,primitive_feature_space *features,size_t len)

{
  example *peVar1;
  long lVar2;
  ulong in_RCX;
  long in_RDX;
  string *in_RSI;
  vw *in_RDI;
  size_t j;
  uchar index;
  size_t i;
  vw *in_stack_00000040;
  example *ret;
  uchar *in_stack_ffffffffffffff68;
  vw *in_stack_ffffffffffffff70;
  example *in_stack_ffffffffffffff78;
  features *in_stack_ffffffffffffff80;
  ulong local_70;
  ulong local_60;
  string *in_stack_ffffffffffffffc0;
  example *in_stack_ffffffffffffffc8;
  vw *in_stack_ffffffffffffffd0;
  
  peVar1 = get_unused_example(in_stack_ffffffffffffff70);
  (*(in_RDI->p->lp).default_label)(&peVar1->l);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    in_stack_ffffffffffffff80 = (features *)&stack0xffffffffffffffb8;
    in_stack_ffffffffffffff70 = in_RDI;
    in_stack_ffffffffffffff78 = peVar1;
    std::__cxx11::string::string((string *)in_stack_ffffffffffffff80,in_RSI);
    parse_example_label(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  for (local_60 = 0; local_60 < in_RCX; local_60 = local_60 + 1) {
    v_array<unsigned_char>::push_back
              ((v_array<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    for (local_70 = 0; local_70 < *(ulong *)(in_RDX + local_60 * 0x18 + 0x10);
        local_70 = local_70 + 1) {
      ::features::push_back
                (in_stack_ffffffffffffff80,(feature_value)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                 ,(feature_index)in_stack_ffffffffffffff70);
    }
  }
  setup_example(in_stack_00000040,(example *)i);
  in_RDI->p->end_parsed_examples = in_RDI->p->end_parsed_examples + 1;
  return peVar1;
}

Assistant:

example* import_example(vw& all, string label, primitive_feature_space* features, size_t len)
{
  example* ret = &get_unused_example(&all);
  all.p->lp.default_label(&ret->l);

  if (label.length() > 0)
    parse_example_label(all, *ret, label);

  for (size_t i = 0; i < len; i++)
  {
    unsigned char index = features[i].name;
    ret->indices.push_back(index);
    for (size_t j = 0; j < features[i].len; j++)
      ret->feature_space[index].push_back(features[i].fs[j].x, features[i].fs[j].weight_index);
  }

  setup_example(all, ret);
  all.p->end_parsed_examples++;
  return ret;
}